

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTPNStm * __thiscall CTcParser::parse_goto(CTcParser *this,int *err)

{
  tc_toktyp_t tVar1;
  int iVar2;
  CTPNStmGoto *this_00;
  int *siz;
  
  siz = err;
  tVar1 = CTcTokenizer::next(G_tok);
  if (tVar1 == TOKT_SYM) {
    this_00 = (CTPNStmGoto *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)siz);
    CTPNStmGoto::CTPNStmGoto(this_00,(G_tok->curtok_).text_,(G_tok->curtok_).text_len_);
    CTcTokenizer::next(G_tok);
  }
  else {
    this_00 = (CTPNStmGoto *)0x0;
    CTcTokenizer::log_error(0x2b57);
  }
  iVar2 = parse_req_sem();
  if (iVar2 != 0) {
    *err = 1;
    this_00 = (CTPNStmGoto *)0x0;
  }
  return (CTPNStm *)this_00;
}

Assistant:

CTPNStm *CTcParser::parse_goto(int *err)
{
    CTPNStmGoto *goto_stm;
    
    /* skip the 'goto' keyword, and demand that a symbol follows */
    if (G_tok->next() == TOKT_SYM)
    {
        /* create the parse node for the 'goto' statement */
        goto_stm = new CTPNStmGoto(G_tok->getcur()->get_text(),
                                   G_tok->getcur()->get_text_len());
        
        /* skip the symbol */
        G_tok->next();
    }
    else
    {
        /* log the error */
        G_tok->log_error(TCERR_GOTO_REQ_LABEL);

        /* no statement */
        goto_stm = 0;
    }

    /* parse the required semicolon */
    if (parse_req_sem())
    {
        *err = TRUE;
        return 0;
    }

    /* return the statement node */
    return goto_stm;
}